

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

void __thiscall
ON_3dmAnnotationSettings::Internal_CopyFrom
          (ON_3dmAnnotationSettings *this,ON_3dmAnnotationSettings *src)

{
  ON_3dmAnnotationSettingsPrivate *pOVar1;
  undefined8 uVar2;
  float fVar3;
  bool bVar4;
  undefined3 uVar5;
  uint uVar6;
  uint uVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  ON_3dmAnnotationSettingsPrivate *pOVar10;
  
  this->m_dimscale = src->m_dimscale;
  this->m_textheight = src->m_textheight;
  this->m_dimexe = src->m_dimexe;
  this->m_dimexo = src->m_dimexo;
  this->m_arrowlength = src->m_arrowlength;
  this->m_arrowwidth = src->m_arrowwidth;
  this->m_centermark = src->m_centermark;
  this->m_b_V5_EnableAnnotationScaling = src->m_b_V5_EnableAnnotationScaling;
  this->m_bEnableModelSpaceAnnotationScaling = src->m_bEnableModelSpaceAnnotationScaling;
  this->m_bEnableLayoutSpaceAnnotationScaling = src->m_bEnableLayoutSpaceAnnotationScaling;
  this->m_bEnableHatchScaling = src->m_bEnableHatchScaling;
  this->m_reserved1 = src->m_reserved1;
  this->m_reserved2 = src->m_reserved2;
  this->m_reserved3 = src->m_reserved3;
  this->m_reserved4 = src->m_reserved4;
  this->m_dimunits = src->m_dimunits;
  this->m_arrowtype = src->m_arrowtype;
  this->m_angularunits = src->m_angularunits;
  this->m_lengthformat = src->m_lengthformat;
  this->m_angleformat = src->m_angleformat;
  this->m_resolution = src->m_resolution;
  ON_wString::operator=(&this->m_facename,&src->m_facename);
  if (src->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0) {
    pOVar10 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
    pOVar10->m_world_view_text_scale = 0.0;
    pOVar10->m_world_view_hatch_scale = 0.0;
    pOVar10->m_use_dimension_layer = false;
    *(undefined3 *)&pOVar10->field_0x9 = 0;
    (pOVar10->m_dimension_layer_id).Data1 = 0;
    (pOVar10->m_dimension_layer_id).Data1 = 0;
    (pOVar10->m_dimension_layer_id).Data2 = 0;
    (pOVar10->m_dimension_layer_id).Data3 = 0;
    (pOVar10->m_dimension_layer_id).Data4[0] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[1] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[2] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[3] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[4] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[5] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[6] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[7] = '\0';
    pOVar10->m_world_view_text_scale = 1.0;
    pOVar10->m_world_view_hatch_scale = 1.0;
    pOVar10->m_use_dimension_layer = false;
    (pOVar10->m_dimension_layer_id).Data1 = 0;
    (pOVar10->m_dimension_layer_id).Data2 = 0;
    (pOVar10->m_dimension_layer_id).Data3 = 0;
    (pOVar10->m_dimension_layer_id).Data4[0] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[1] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[2] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[3] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[4] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[5] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[6] = '\0';
    (pOVar10->m_dimension_layer_id).Data4[7] = '\0';
    this->m_private = pOVar10;
    pOVar1 = src->m_private;
    fVar3 = pOVar1->m_world_view_hatch_scale;
    bVar4 = pOVar1->m_use_dimension_layer;
    uVar5 = *(undefined3 *)&pOVar1->field_0x9;
    uVar6 = (pOVar1->m_dimension_layer_id).Data1;
    uVar7 = (pOVar1->m_dimension_layer_id).Data1;
    uVar8 = (pOVar1->m_dimension_layer_id).Data2;
    uVar9 = (pOVar1->m_dimension_layer_id).Data3;
    uVar2 = *(undefined8 *)(pOVar1->m_dimension_layer_id).Data4;
    pOVar10->m_world_view_text_scale = pOVar1->m_world_view_text_scale;
    pOVar10->m_world_view_hatch_scale = fVar3;
    pOVar10->m_use_dimension_layer = bVar4;
    *(undefined3 *)&pOVar10->field_0x9 = uVar5;
    (pOVar10->m_dimension_layer_id).Data1 = uVar6;
    (pOVar10->m_dimension_layer_id).Data1 = uVar7;
    (pOVar10->m_dimension_layer_id).Data2 = uVar8;
    (pOVar10->m_dimension_layer_id).Data3 = uVar9;
    *(undefined8 *)(pOVar10->m_dimension_layer_id).Data4 = uVar2;
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::Internal_CopyFrom(const ON_3dmAnnotationSettings& src)
{
  m_dimscale = src.m_dimscale;
  m_textheight = src.m_textheight;
  m_dimexe = src.m_dimexe;
  m_dimexo = src.m_dimexo;
  m_arrowlength = src.m_arrowlength;
  m_arrowwidth = src.m_arrowwidth;
  m_centermark = src.m_centermark;
  
  m_b_V5_EnableAnnotationScaling = src.m_b_V5_EnableAnnotationScaling;
  m_bEnableModelSpaceAnnotationScaling = src.m_bEnableModelSpaceAnnotationScaling;
  m_bEnableLayoutSpaceAnnotationScaling = src.m_bEnableLayoutSpaceAnnotationScaling;
  m_bEnableHatchScaling = src.m_bEnableHatchScaling;
  
  m_reserved1 = src.m_reserved1;
  m_reserved2 = src.m_reserved2;
  m_reserved3 = src.m_reserved3;
  m_reserved4 = src.m_reserved4;
  
  m_dimunits = src.m_dimunits;
  m_arrowtype = src.m_arrowtype;
  m_angularunits = src.m_angularunits;
  m_lengthformat = src.m_lengthformat;
  m_angleformat = src.m_angleformat;
  m_resolution = src.m_resolution;
  m_facename = src.m_facename;

  if (src.m_private)
  {
    m_private = new ON_3dmAnnotationSettingsPrivate();
    *m_private = *src.m_private;
  }
}